

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.cpp
# Opt level: O0

void test_qclab_dense_kron<float>(void)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1f8;
  AssertHelper local_1d8;
  Message local_1d0;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__3;
  SquareMatrix<float> BoA_check;
  SquareMatrix<float> BoA;
  AssertHelper local_170;
  Message local_168;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__2;
  SquareMatrix<float> AoB_check;
  SquareMatrix<float> AoB;
  SquareMatrix<float> B;
  SquareMatrix<float> A;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  SquareMatrix<float> XoI_check;
  SquareMatrix<float> XoI;
  AssertHelper local_80;
  Message local_78;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  SquareMatrix<float> IoX_check;
  SquareMatrix<float> IoX;
  undefined1 local_28 [8];
  SquareMatrix<float> X;
  SquareMatrix<float> I;
  
  qclab::dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)&X.data_,1.0,0.0,0.0,1.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)local_28,0.0,1.0,1.0,0.0);
  qclab::dense::kron<float>
            ((dense *)&IoX_check.data_,(SquareMatrix<float> *)&X.data_,
             (SquareMatrix<float> *)local_28);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_.message_,0.0,1.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,0.0,0.0,
             1.0,0.0,0.0,1.0,0.0);
  local_69 = qclab::dense::SquareMatrix<float>::operator==
                       ((SquareMatrix<float> *)&IoX_check.data_,
                        (SquareMatrix<float> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&XoI.data_,(internal *)local_68,(AssertionResult *)"IoX == IoX_check",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/dense/kron.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&XoI.data_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  qclab::dense::kron<float>
            ((dense *)&XoI_check.data_,(SquareMatrix<float> *)local_28,
             (SquareMatrix<float> *)&X.data_);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__1.message_,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0,1.0,0.0,
             0.0,0.0,0.0,1.0,0.0,0.0);
  local_d1 = qclab::dense::SquareMatrix<float>::operator==
                       ((SquareMatrix<float> *)&XoI_check.data_,
                        (SquareMatrix<float> *)&gtest_ar__1.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&A.data_,(internal *)local_d0,(AssertionResult *)"XoI == XoI_check","false"
               ,"true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/dense/kron.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&A.data_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  qclab::dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)&B.data_,1.0,2.0,3.0,5.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&AoB.data_,7.0,11.0,13.0,17.0);
  qclab::dense::kron<float>
            ((dense *)&AoB_check.data_,(SquareMatrix<float> *)&B.data_,
             (SquareMatrix<float> *)&AoB.data_);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__2.message_,7.0,11.0,14.0,22.0,13.0,17.0,26.0,34.0,
             21.0,33.0,35.0,55.0,39.0,51.0,65.0,85.0);
  local_159 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&AoB_check.data_,
                         (SquareMatrix<float> *)&gtest_ar__2.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_158,&local_159,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&BoA.data_,(internal *)local_158,(AssertionResult *)"AoB == AoB_check",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/dense/kron.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    std::__cxx11::string::~string((string *)&BoA.data_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  qclab::dense::kron<float>
            ((dense *)&BoA_check.data_,(SquareMatrix<float> *)&AoB.data_,
             (SquareMatrix<float> *)&B.data_);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__3.message_,7.0,14.0,11.0,22.0,21.0,35.0,33.0,55.0,
             13.0,26.0,17.0,34.0,39.0,65.0,51.0,85.0);
  local_1c1 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&BoA_check.data_,
                         (SquareMatrix<float> *)&gtest_ar__3.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)local_1c0,(AssertionResult *)"BoA == BoA_check","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/dense/kron.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__3.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&BoA_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__2.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&AoB_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&AoB.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&B.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__1.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&XoI_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&IoX_check.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_28);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&X.data_);
  return;
}

Assistant:

void test_qclab_dense_kron() {

  qclab::dense::SquareMatrix< T >  I( 1 , 0 ,
                                      0 , 1 ) ;
  qclab::dense::SquareMatrix< T >  X( 0 , 1 ,
                                      1 , 0 ) ;
//std::cout << "I =\n" ; qclab::printMatrix2x2( I ) ;
//std::cout << "X =\n" ; qclab::printMatrix2x2( X ) ;

  qclab::dense::SquareMatrix< T >  IoX = qclab::dense::kron( I , X ) ;
  qclab::dense::SquareMatrix< T >  IoX_check( 0 , 1 , 0 , 0 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              0 , 0 , 1 , 0 ) ;
  EXPECT_TRUE( IoX == IoX_check ) ;
//std::cout << "I otimes X =\n" ; qclab::printMatrix4x4( IoX ) ;

  qclab::dense::SquareMatrix< T >  XoI = qclab::dense::kron( X , I ) ;
  qclab::dense::SquareMatrix< T >  XoI_check( 0 , 0 , 1 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 1 , 0 , 0 ) ;
  EXPECT_TRUE( XoI == XoI_check ) ;
//std::cout << "X otimes I =\n" ; qclab::printMatrix4x4( XoI ) ;

  qclab::dense::SquareMatrix< T >  A(  1 ,  2 ,
                                       3 ,  5 ) ;
  qclab::dense::SquareMatrix< T >  B(  7 , 11 ,
                                      13 , 17 ) ;
//std::cout << "A =\n" ; qclab::printMatrix2x2( A ) ;
//std::cout << "B =\n" ; qclab::printMatrix2x2( B ) ;

  qclab::dense::SquareMatrix< T >  AoB = qclab::dense::kron( A , B ) ;
  qclab::dense::SquareMatrix< T >  AoB_check(  7 , 11 , 14 , 22 ,
                                              13 , 17 , 26 , 34 ,
                                              21 , 33 , 35 , 55 ,
                                              39 , 51 , 65 , 85 ) ;
  EXPECT_TRUE( AoB == AoB_check ) ;
//std::cout << "A otimes B =\n" ; qclab::printMatrix4x4( AoB ) ;

  qclab::dense::SquareMatrix< T >  BoA = qclab::dense::kron( B , A ) ;
  qclab::dense::SquareMatrix< T >  BoA_check(  7 , 14 , 11 , 22 ,
                                              21 , 35 , 33 , 55 ,
                                              13 , 26 , 17 , 34 ,
                                              39 , 65 , 51 , 85 ) ;
  EXPECT_TRUE( BoA == BoA_check ) ;
//std::cout << "B otimes A =\n" ; qclab::printMatrix4x4( BoA ) ;

}